

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void wasm::EffectAnalyzer::InternalAnalyzer::doStartCatch(InternalAnalyzer *self,Expression **currp)

{
  bool bVar1;
  Try *this;
  size_type sVar2;
  Try *curr;
  Expression **currp_local;
  InternalAnalyzer *self_local;
  
  this = Expression::cast<wasm::Try>(*currp);
  bVar1 = IString::is((IString *)(this + 0x10));
  if (bVar1) {
    sVar2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                      (&self->parent->delegateTargets,(key_type *)(this + 0x10));
    if ((sVar2 != 0) && (self->parent->tryDepth == 0)) {
      self->parent->throws_ = true;
    }
    std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::erase
              (&self->parent->delegateTargets,(key_type *)(this + 0x10));
  }
  bVar1 = Try::hasCatchAll(this);
  if (bVar1) {
    if (self->parent->tryDepth == 0) {
      __assert_fail("self->parent.tryDepth > 0 && \"try depth cannot be negative\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/effects.h"
                    ,0x1d6,
                    "static void wasm::EffectAnalyzer::InternalAnalyzer::doStartCatch(InternalAnalyzer *, Expression **)"
                   );
    }
    self->parent->tryDepth = self->parent->tryDepth - 1;
  }
  self->parent->catchDepth = self->parent->catchDepth + 1;
  return;
}

Assistant:

static void doStartCatch(InternalAnalyzer* self, Expression** currp) {
      Try* curr = (*currp)->cast<Try>();
      // This is conservative. When an inner try-delegate targets the current
      // expression, even if the try-delegate's body can't throw, we consider
      // the current expression can throw for simplicity, unless the current
      // expression is not inside a try-catch_all. It is hard to figure out
      // whether the original try-delegate's body throws or not at this point.
      if (curr->name.is()) {
        if (self->parent.delegateTargets.count(curr->name) &&
            self->parent.tryDepth == 0) {
          self->parent.throws_ = true;
        }
        self->parent.delegateTargets.erase(curr->name);
      }
      // We only count 'try's with a 'catch_all' because instructions within a
      // 'try' without a 'catch_all' can still throw outside of the try.
      if (curr->hasCatchAll()) {
        assert(self->parent.tryDepth > 0 && "try depth cannot be negative");
        self->parent.tryDepth--;
      }
      self->parent.catchDepth++;
    }